

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall
svg::Text::Text(Text *this,Point *origin,string *content,Fill *fill,Font *font,Stroke *stroke)

{
  _func_int **pp_Var1;
  string *in_RDX;
  undefined8 *in_RSI;
  Stroke *in_RDI;
  Fill *in_stack_ffffffffffffffb8;
  Font *this_00;
  Shape *in_stack_ffffffffffffffc0;
  
  Shape::Shape(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI);
  (in_RDI->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Text_0011ad28;
  pp_Var1 = (_func_int **)in_RSI[1];
  *(undefined8 *)&in_RDI[1].nonScaling = *in_RSI;
  in_RDI[2].super_Serializeable._vptr_Serializeable = pp_Var1;
  this_00 = (Font *)&in_RDI[2].width;
  std::__cxx11::string::string((string *)this_00,in_RDX);
  Font::Font((Font *)in_stack_ffffffffffffffc0,this_00);
  return;
}

Assistant:

Text(Point const & origin, std::string const & content, Fill const & fill = Fill(),
             Font const & font = Font(), Stroke const & stroke = Stroke())
            : Shape(fill, stroke), origin(origin), content(content), font(font) { }